

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

void __thiscall google::protobuf::Map<long,_double>::InnerMap::clear(InnerMap *this)

{
  bool bVar1;
  LogMessage *other;
  reference pplVar2;
  _Self local_b0;
  _Base_ptr local_a8;
  Node *local_a0;
  _Rb_tree_const_iterator<long_*> local_98;
  iterator next_1;
  Node *node_1;
  iterator tree_it;
  LogMessage local_68;
  set<long*,google::protobuf::Map<long,double>::InnerMap::KeyCompare,google::protobuf::Map<long,double>::MapAllocator<long*>>
  *local_30;
  Tree *tree;
  Node *next;
  Node *node;
  size_type b;
  InnerMap *this_local;
  
  b = (size_type)this;
  for (node = (Node *)0x0; node < (Node *)this->num_buckets_;
      node = (Node *)((long)&(node->kv).k_ + 1)) {
    bVar1 = TableEntryIsNonEmptyList(this,(size_type)node);
    if (bVar1) {
      next = (Node *)this->table_[(long)node];
      this->table_[(long)node] = (void *)0x0;
      do {
        tree = (Tree *)next->next;
        DestroyNode(this,next);
        next = (Node *)tree;
      } while (tree != (Tree *)0x0);
    }
    else {
      bVar1 = TableEntryIsTree(this,(size_type)node);
      if (bVar1) {
        local_30 = (set<long*,google::protobuf::Map<long,double>::InnerMap::KeyCompare,google::protobuf::Map<long,double>::MapAllocator<long*>>
                    *)this->table_[(long)node];
        bVar1 = false;
        if ((this->table_[(long)node] != this->table_[(long)((long)&(node->kv).k_ + 1)]) ||
           (((ulong)node & 1) != 0)) {
          internal::LogMessage::LogMessage
                    (&local_68,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/map.h"
                     ,0x1fe);
          bVar1 = true;
          other = internal::LogMessage::operator<<
                            (&local_68,"CHECK failed: table_[b] == table_[b + 1] && (b & 1) == 0: ")
          ;
          internal::LogFinisher::operator=((LogFinisher *)((long)&tree_it._M_node + 3),other);
        }
        if (bVar1) {
          internal::LogMessage::~LogMessage(&local_68);
        }
        this->table_[(long)((long)&(node->kv).k_ + 1)] = (void *)0x0;
        this->table_[(long)node] = (void *)0x0;
        node_1 = (Node *)std::
                         set<long_*,_google::protobuf::Map<long,_double>::InnerMap::KeyCompare,_google::protobuf::Map<long,_double>::MapAllocator<long_*>_>
                         ::begin((set<long_*,_google::protobuf::Map<long,_double>::InnerMap::KeyCompare,_google::protobuf::Map<long,_double>::MapAllocator<long_*>_>
                                  *)local_30);
        do {
          pplVar2 = std::_Rb_tree_const_iterator<long_*>::operator*
                              ((_Rb_tree_const_iterator<long_*> *)&node_1);
          next_1._M_node = (_Base_ptr)NodePtrFromKeyPtr(*pplVar2);
          local_98._M_node = (_Base_ptr)node_1;
          std::_Rb_tree_const_iterator<long_*>::operator++(&local_98);
          local_a0 = node_1;
          local_a8 = (_Base_ptr)
                     std::
                     set<long*,google::protobuf::Map<long,double>::InnerMap::KeyCompare,google::protobuf::Map<long,double>::MapAllocator<long*>>
                     ::erase_abi_cxx11_(local_30,(const_iterator)node_1);
          DestroyNode(this,(Node *)next_1._M_node);
          node_1 = (Node *)local_98._M_node;
          local_b0._M_node =
               (_Base_ptr)
               std::
               set<long_*,_google::protobuf::Map<long,_double>::InnerMap::KeyCompare,_google::protobuf::Map<long,_double>::MapAllocator<long_*>_>
               ::end((set<long_*,_google::protobuf::Map<long,_double>::InnerMap::KeyCompare,_google::protobuf::Map<long,_double>::MapAllocator<long_*>_>
                      *)local_30);
          bVar1 = std::operator!=((_Self *)&node_1,&local_b0);
        } while (bVar1);
        DestroyTree(this,(Tree *)local_30);
        node = (Node *)((long)&(node->kv).k_ + 1);
      }
    }
  }
  this->num_elements_ = 0;
  this->index_of_first_non_null_ = this->num_buckets_;
  return;
}

Assistant:

void clear() {
      for (size_type b = 0; b < num_buckets_; b++) {
        if (TableEntryIsNonEmptyList(b)) {
          Node* node = static_cast<Node*>(table_[b]);
          table_[b] = NULL;
          do {
            Node* next = node->next;
            DestroyNode(node);
            node = next;
          } while (node != NULL);
        } else if (TableEntryIsTree(b)) {
          Tree* tree = static_cast<Tree*>(table_[b]);
          GOOGLE_DCHECK(table_[b] == table_[b + 1] && (b & 1) == 0);
          table_[b] = table_[b + 1] = NULL;
          typename Tree::iterator tree_it = tree->begin();
          do {
            Node* node = NodePtrFromKeyPtr(*tree_it);
            typename Tree::iterator next = tree_it;
            ++next;
            tree->erase(tree_it);
            DestroyNode(node);
            tree_it = next;
          } while (tree_it != tree->end());
          DestroyTree(tree);
          b++;
        }
      }
      num_elements_ = 0;
      index_of_first_non_null_ = num_buckets_;
    }